

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O0

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
toktxApp::scaleImage
          (toktxApp *this,unique_ptr<Image,_std::default_delete<Image>_> *pImage,ktx_uint32_t width,
          ktx_uint32_t height)

{
  pointer pIVar1;
  undefined8 uVar2;
  uint in_ECX;
  long in_RSI;
  __uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true> in_RDI;
  uint in_R8D;
  stringstream message;
  runtime_error *e;
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_fffffffffffffdc8;
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_fffffffffffffdd0;
  undefined1 local_28 [8];
  uint local_20;
  uint local_1c;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  pIVar1 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                     ((unique_ptr<Image,_std::default_delete<Image>_> *)0x11856a);
  uVar2 = std::__cxx11::string::c_str();
  (*pIVar1->_vptr_Image[0x11])
            (*(undefined4 *)(in_RSI + 0x2d8),local_28,pIVar1,(ulong)local_1c,(ulong)local_20,uVar2,2
            );
  std::unique_ptr<Image,_std::default_delete<Image>_>::operator=
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr(in_stack_fffffffffffffdd0);
  std::unique_ptr<Image,_std::default_delete<Image>_>::unique_ptr
            (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (tuple<Image_*,_std::default_delete<Image>_>)
         in_RDI.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
         super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
         super__Head_base<0UL,_Image_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<Image>
toktxApp::scaleImage(unique_ptr<Image> pImage, ktx_uint32_t width, ktx_uint32_t height)
{
    try {
        pImage = pImage->resample(width, height,
                        options.gmopts.filter.c_str(),
                        options.gmopts.filterScale,
                        basisu::Resampler::Boundary_Op::BOUNDARY_CLAMP);
    } catch (runtime_error& e) {
        stringstream message;
        message << "Image::resample() failed! " << e.what();
        // A couple of the exceptions have to do with memory but the
        // others are "too large an image" and "unknown filter." The
        // latter are much more likely to occur hence choice of exception.
        throw cant_create_image(message.str());
    }
    return pImage;
}